

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_thrd_quit(void)

{
  uo_cb_func_linkpool_thrd_quit();
  uo_cb_linkpool_thrd_quit();
  uo_refcount_linkpool_thrd_quit();
  return;
}

Assistant:

void uo_cb_thrd_quit()
{
    uo_cb_func_linkpool_thrd_quit();
    uo_cb_linkpool_thrd_quit();
    uo_refcount_linkpool_thrd_quit();
}